

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O2

int Abc_NtkRetimeMinDelayTry
              (Abc_Ntk_t *pNtk,int nDelayLim,int fForward,int fInitial,int nIterLimit,int *pIterBest
              ,int fVerbose)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar4;
  long *plVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_84;
  int local_70;
  Abc_Ntk_t *local_68;
  Vec_Int_t *local_60;
  
  if (fInitial == 0) {
    if (fVerbose == 0) goto LAB_003d3525;
    puts("Performing analysis:");
    bVar1 = false;
  }
  else {
    if (fForward == 0) {
      local_60 = Abc_NtkRetimeCollectLatchValues(pNtk);
      local_68 = Abc_NtkRetimeBackwardInitialStart(pNtk);
      bVar1 = true;
      goto LAB_003d355e;
    }
    Abc_NtkRetimeTranferToCopy(pNtk);
LAB_003d3525:
    bVar1 = true;
  }
  local_68 = (Abc_Ntk_t *)0x0;
  local_60 = (Vec_Int_t *)0x0;
LAB_003d355e:
  local_70 = pNtk->nObjCounts[8];
  p = Vec_PtrAlloc(100);
  pcVar7 = "Fwd";
  if (fForward == 0) {
    pcVar7 = "Bwd";
  }
  local_84 = 0xffffffff;
  local_90 = 1000000000;
  local_98 = 0;
  local_94 = 0;
  while( true ) {
    Abc_NtkIncrementTravId(pNtk);
    p_00 = Vec_PtrAlloc(pNtk->nObjCounts[8]);
    for (iVar9 = 0; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar9);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        uVar2 = *(uint *)&pAVar4->field_0x14;
        uVar6 = uVar2 & 0xf;
        if (uVar6 == 8) {
          Vec_PtrPush(p_00,pAVar4);
          uVar2 = *(uint *)&pAVar4->field_0x14;
          uVar6 = uVar2 & 0xf;
        }
        if (uVar6 != 7) {
          *(uint *)&pAVar4->field_0x14 = uVar2 & 0xfff;
          Abc_NodeSetTravIdCurrent(pAVar4);
        }
      }
    }
    iVar9 = p_00->nSize;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (fForward == 0) {
      uVar2 = 0;
      for (iVar10 = 0; iVar9 != iVar10; iVar10 = iVar10 + 1) {
        plVar5 = (long *)Vec_PtrEntry(p_00,iVar10);
        uVar6 = Abc_NtkRetimeTiming_rec
                          (*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8)
                           ,0);
        if ((int)uVar2 <= (int)uVar6) {
          uVar2 = uVar6;
        }
      }
      for (iVar10 = 0; iVar10 < pNtk->vPos->nSize; iVar10 = iVar10 + 1) {
        plVar5 = (long *)Vec_PtrEntry(pNtk->vPos,iVar10);
        uVar6 = Abc_NtkRetimeTiming_rec
                          (*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8)
                           ,0);
        if ((int)uVar2 <= (int)uVar6) {
          uVar2 = uVar6;
        }
      }
    }
    else {
      uVar2 = 0;
      for (iVar10 = 0; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        plVar5 = (long *)Vec_PtrEntry(p_00,iVar10);
        for (lVar8 = 0; lVar8 < *(int *)((long)plVar5 + 0x2c); lVar8 = lVar8 + 1) {
          uVar6 = Abc_NtkRetimeTiming_rec
                            (*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                              (long)*(int *)(plVar5[6] + lVar8 * 4) * 8),fForward);
          if ((int)uVar2 <= (int)uVar6) {
            uVar2 = uVar6;
          }
        }
      }
      for (iVar10 = 0; iVar10 < pNtk->vPis->nSize; iVar10 = iVar10 + 1) {
        plVar5 = (long *)Vec_PtrEntry(pNtk->vPis,iVar10);
        for (lVar8 = 0; lVar8 < *(int *)((long)plVar5 + 0x2c); lVar8 = lVar8 + 1) {
          uVar6 = Abc_NtkRetimeTiming_rec
                            (*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                              (long)*(int *)(plVar5[6] + lVar8 * 4) * 8),fForward);
          if ((int)uVar2 <= (int)uVar6) {
            uVar2 = uVar6;
          }
        }
      }
    }
    p->nSize = 0;
    Abc_NtkIncrementTravId(pNtk);
    if (fForward == 0) {
      for (iVar10 = 0; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        plVar5 = (long *)Vec_PtrEntry(p_00,iVar10);
        for (lVar8 = 0; lVar8 < *(int *)((long)plVar5 + 0x1c); lVar8 = lVar8 + 1) {
          pAVar4 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                    (long)*(int *)(plVar5[4] + lVar8 * 4) * 8);
          iVar3 = Abc_NodeIsTravIdCurrent(pAVar4);
          if ((iVar3 == 0) && (uVar2 == *(uint *)&pAVar4->field_0x14 >> 0xc)) {
            Vec_PtrPush(p,pAVar4);
            Abc_NodeSetTravIdCurrent(pAVar4);
          }
        }
      }
    }
    else {
      for (iVar10 = 0; iVar10 != iVar9; iVar10 = iVar10 + 1) {
        plVar5 = (long *)Vec_PtrEntry(p_00,iVar10);
        for (lVar8 = 0; lVar8 < *(int *)((long)plVar5 + 0x2c); lVar8 = lVar8 + 1) {
          pAVar4 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                    (long)*(int *)(plVar5[6] + lVar8 * 4) * 8);
          iVar3 = Abc_NodeIsTravIdCurrent(pAVar4);
          if ((iVar3 == 0) && (uVar2 == *(uint *)&pAVar4->field_0x14 >> 0xc)) {
            Vec_PtrPush(p,pAVar4);
            Abc_NodeSetTravIdCurrent(pAVar4);
          }
        }
      }
    }
    Vec_PtrFree(p_00);
    if (local_98 == 0) {
      local_84 = uVar2;
    }
    if (local_90 - uVar2 != 0 && (int)uVar2 <= (int)local_90) {
      if (!bVar1) {
        dVar11 = (double)(pNtk->nObjCounts[8] - local_70);
        dVar12 = (double)(int)(local_90 - uVar2);
        printf("%s Iter = %3d. Delay = %3d. Latches = %5d. Delta = %6.2f. Ratio = %4.2f %%\n",
               dVar11 / dVar12,((dVar11 * 100.0) / (double)pNtk->nObjCounts[8]) / dVar12,pcVar7,
               (ulong)local_98,(ulong)uVar2);
      }
      local_70 = pNtk->nObjCounts[8];
      local_94 = local_98;
      local_90 = uVar2;
    }
    if (((local_98 == nIterLimit) || (0x14 < (int)(local_98 - local_94))) ||
       (0 < nDelayLim && (int)uVar2 <= nDelayLim)) break;
    iVar10 = 0;
    iVar9 = p->nSize;
    if (p->nSize < 1) {
      iVar9 = 0;
    }
    for (; iVar9 != iVar10; iVar10 = iVar10 + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar10);
      iVar3 = Abc_NtkRetimeNodeIsEnabled(pAVar4,fForward);
      if (iVar3 != 0) {
        Abc_NtkRetimeNode(pAVar4,fForward,fInitial);
      }
    }
    if (fForward == 0) {
      Abc_NtkRetimeShareLatches(pNtk,fInitial);
    }
    local_98 = local_98 + 1;
  }
  Vec_PtrFree(p);
  if (fInitial != 0) {
    if (fForward == 0) {
      Abc_NtkRetimeBackwardInitialFinish(pNtk,local_68,local_60,fVerbose);
      Abc_NtkDelete(local_68);
      free(local_60->pArray);
      free(local_60);
    }
    else {
      Abc_NtkRetimeTranferFromCopy(pNtk);
    }
  }
  if (!bVar1) {
    pcVar7 = "Forward ";
    if (fForward == 0) {
      pcVar7 = "Backward";
    }
    printf("%s : Starting delay = %3d.  Final delay = %3d.  IterBest = %2d (out of %2d).\n",pcVar7,
           (ulong)local_84,(ulong)local_90,(ulong)local_94,(ulong)(uint)nIterLimit);
  }
  if (nIterLimit == 1) {
    local_94 = 1;
  }
  *pIterBest = local_94;
  return local_90;
}

Assistant:

int Abc_NtkRetimeMinDelayTry( Abc_Ntk_t * pNtk, int nDelayLim, int fForward, int fInitial, int nIterLimit, int * pIterBest, int fVerbose )
{
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vCritical;
    Vec_Int_t * vValues = NULL; // Suppress "might be used uninitialized"
    Abc_Obj_t * pObj;
    int i, k, IterBest, DelayCur, DelayBest;
    int DelayStart = -1; // Suppress "might be used uninitialized"
    int LatchesBest;
    // transfer intitial values
    if ( fInitial )
    {
        if ( fForward )
            Abc_NtkRetimeTranferToCopy( pNtk );
        else
        {
            // save initial value of the latches
            vValues = Abc_NtkRetimeCollectLatchValues( pNtk );
            // start the network for initial value computation
            pNtkNew = Abc_NtkRetimeBackwardInitialStart( pNtk );
        }
    }

if ( fVerbose && !fInitial )
    printf( "Performing analysis:\n" );
    // find the best iteration
    DelayBest = ABC_INFINITY; IterBest = 0; LatchesBest = Abc_NtkLatchNum(pNtk);
    vCritical = Vec_PtrAlloc( 100 );
    for ( i = 0; ; i++ )
    {
        // perform moves for the timing-critical nodes
        DelayCur = Abc_NtkRetimeTiming( pNtk, fForward, vCritical );
        if ( i == 0 )
            DelayStart = DelayCur;
        // record this position if it has the best delay
        if ( DelayBest > DelayCur )
        {
if ( fVerbose && !fInitial )
    printf( "%s Iter = %3d. Delay = %3d. Latches = %5d. Delta = %6.2f. Ratio = %4.2f %%\n", 
        fForward ? "Fwd": "Bwd", i, DelayCur, Abc_NtkLatchNum(pNtk), 
        1.0*(Abc_NtkLatchNum(pNtk)-LatchesBest)/(DelayBest-DelayCur), 
        100.0*(Abc_NtkLatchNum(pNtk)-LatchesBest)/Abc_NtkLatchNum(pNtk)/(DelayBest-DelayCur) );

            DelayBest = DelayCur;
            IterBest = i;
            LatchesBest = Abc_NtkLatchNum(pNtk);
        }
        // quit after timing analysis
        if ( i == nIterLimit )
            break;
        // skip if 10 interations did not give improvement
        if ( i - IterBest > 20 )
            break;
        // skip if delay limit is reached
        if ( nDelayLim > 0 && DelayCur <= nDelayLim )
            break;
        // try retiming to improve the delay
        Vec_PtrForEachEntry( Abc_Obj_t *, vCritical, pObj, k )
            if ( Abc_NtkRetimeNodeIsEnabled(pObj, fForward) )
                Abc_NtkRetimeNode( pObj, fForward, fInitial );
        // share latches
        if ( !fForward )
            Abc_NtkRetimeShareLatches( pNtk, fInitial );    
    }
    Vec_PtrFree( vCritical );
    // transfer the initial state back to the latches
    if ( fInitial )
    {
        if ( fForward )
            Abc_NtkRetimeTranferFromCopy( pNtk );
        else
        {
            Abc_NtkRetimeBackwardInitialFinish( pNtk, pNtkNew, vValues, fVerbose );
            Abc_NtkDelete( pNtkNew );
            Vec_IntFree( vValues );
        }
    }
if ( fVerbose && !fInitial )
    printf( "%s : Starting delay = %3d.  Final delay = %3d.  IterBest = %2d (out of %2d).\n", 
        fForward? "Forward " : "Backward", DelayStart, DelayBest, IterBest, nIterLimit );
    *pIterBest = (nIterLimit == 1) ? 1 : IterBest;
    return DelayBest;
}